

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O3

void __thiscall cmFileAPI::ReadClientQuery(cmFileAPI *this,string *client,ClientQueryJson *q)

{
  pointer pcVar1;
  bool bVar2;
  long *plVar3;
  Value *pVVar4;
  pointer pCVar5;
  size_type *psVar6;
  Value query;
  string queryFile;
  ValueHolder local_120 [2];
  CommentInfo *local_110 [3];
  string local_f8;
  undefined1 local_d8 [24];
  _Alloc_hider _Stack_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  Value local_98;
  Value local_70;
  vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_> local_48;
  
  pcVar1 = (this->APIv1)._M_dataplus._M_p;
  local_120[0].string_ = (char *)local_110;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_120,pcVar1,pcVar1 + (this->APIv1)._M_string_length);
  std::__cxx11::string::append((char *)&local_120[0].int_);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_120[0].int_,(ulong)(client->_M_dataplus)._M_p);
  pCVar5 = (pointer)(plVar3 + 2);
  if ((pointer)*plVar3 == pCVar5) {
    local_d8._16_8_ = *(undefined8 *)&pCVar5->super_Object;
    _Stack_c0._M_p = (pointer)plVar3[3];
    local_d8._0_8_ = (pointer)(local_d8 + 0x10);
  }
  else {
    local_d8._16_8_ = *(undefined8 *)&pCVar5->super_Object;
    local_d8._0_8_ = (pointer)*plVar3;
  }
  local_d8._8_8_ = plVar3[1];
  *plVar3 = (long)pCVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append(local_d8);
  psVar6 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_f8.field_2._M_allocated_capacity = *psVar6;
    local_f8.field_2._8_8_ = plVar3[3];
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  }
  else {
    local_f8.field_2._M_allocated_capacity = *psVar6;
    local_f8._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_f8._M_string_length = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((pointer)local_d8._0_8_ != (pointer)(local_d8 + 0x10)) {
    operator_delete((void *)local_d8._0_8_,(ulong)((long)&((Object *)local_d8._16_8_)->Kind + 1));
  }
  if (local_120[0] != local_110) {
    operator_delete(local_120[0].string_,(ulong)((long)&local_110[0]->comment_ + 1));
  }
  Json::Value::Value((Value *)local_120,nullValue);
  bVar2 = ReadJsonFile(this,&local_f8,(Value *)local_120,&q->Error);
  if (bVar2) {
    bVar2 = Json::Value::isObject((Value *)local_120);
    if (bVar2) {
      pVVar4 = Json::Value::operator[]((Value *)local_120,"client");
      bVar2 = Json::Value::isNull(pVVar4);
      if (!bVar2) {
        Json::Value::Value(&local_70,pVVar4);
        Json::Value::operator=(&q->ClientValue,&local_70);
        Json::Value::~Value(&local_70);
      }
      pVVar4 = Json::Value::operator[]((Value *)local_120,"requests");
      Json::Value::Value(&local_98,pVVar4);
      Json::Value::operator=(&q->RequestsValue,&local_98);
      Json::Value::~Value(&local_98);
      BuildClientRequests((ClientRequests *)local_d8,this,&q->RequestsValue);
      local_48.
      super__Vector_base<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (q->Requests).
           super_vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>.
           super__Vector_base<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      (q->Requests).
      super_vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>.
      super__Vector_base<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_d8._16_8_;
      local_48.
      super__Vector_base<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (q->Requests).
           super_vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>.
           super__Vector_base<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_48.
      super__Vector_base<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (q->Requests).
           super_vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>.
           super__Vector_base<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      (q->Requests).
      super_vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>.
      super__Vector_base<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_d8._0_8_;
      (q->Requests).
      super_vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>.
      super__Vector_base<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)local_d8._8_8_;
      local_d8._0_8_ = (pointer)0x0;
      local_d8._8_8_ = (pointer)0x0;
      local_d8._16_8_ = (pointer)0x0;
      std::vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>::~vector
                (&local_48);
      std::__cxx11::string::operator=((string *)&(q->Requests).Error,(string *)&_Stack_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Stack_c0._M_p != &local_b0) {
        operator_delete(_Stack_c0._M_p,local_b0._M_allocated_capacity + 1);
      }
      std::vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_>::~vector
                ((vector<cmFileAPI::ClientRequest,_std::allocator<cmFileAPI::ClientRequest>_> *)
                 local_d8);
    }
    else {
      std::__cxx11::string::_M_replace((ulong)q,0,(char *)(q->Error)._M_string_length,0x537c74);
    }
  }
  Json::Value::~Value((Value *)local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmFileAPI::ReadClientQuery(std::string const& client, ClientQueryJson& q)
{
  // Read the query.json file.
  std::string queryFile = this->APIv1 + "/query/" + client + "/query.json";
  Json::Value query;
  if (!this->ReadJsonFile(queryFile, query, q.Error)) {
    return;
  }
  if (!query.isObject()) {
    q.Error = "query root is not an object";
    return;
  }

  Json::Value const& clientValue = query["client"];
  if (!clientValue.isNull()) {
    q.ClientValue = clientValue;
  }
  q.RequestsValue = std::move(query["requests"]);
  q.Requests = this->BuildClientRequests(q.RequestsValue);
}